

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

vec3 polyscope::view::bufferCoordsToWorldRay(vec2 screenCoords)

{
  undefined8 uVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  vec<3,_float,_(glm::qualifier)0> vVar7;
  vec3 vVar8;
  vec3 worldPos;
  vec3 screenPos3;
  vec4 viewport;
  mat4 proj;
  mat4 view;
  vec3 worldRayDir;
  vec<3,_float,_(glm::qualifier)0> *v2;
  vec<3,_float,_(glm::qualifier)0> *v1;
  vec<4,_float,_(glm::qualifier)0> *viewport_00;
  mat<4,_4,_float,_(glm::qualifier)0> *proj_00;
  vec<4,float,(glm::qualifier)0> *this;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffec0;
  vec<3,_float,_(glm::qualifier)0> local_b4;
  vec<4,float,(glm::qualifier)0> local_a8 [16];
  mat<4,_4,_float,_(glm::qualifier)0> local_98;
  vec<4,_float,_(glm::qualifier)0> local_58 [4];
  undefined8 local_18;
  undefined1 auVar3 [64];
  undefined1 auVar6 [56];
  
  local_18 = vmovlpd_avx(in_ZMM0._0_16_);
  viewport_00 = local_58;
  getCameraViewMatrix();
  proj_00 = &local_98;
  getCameraPerspectiveMatrix();
  this = local_a8;
  v2 = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,int,int>
            (this,0.0,0.0,bufferWidth,bufferHeight);
  auVar6 = (undefined1  [56])0x0;
  v1 = &local_b4;
  glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
            ((vec<3,float,(glm::qualifier)0> *)v1,(float)local_18,
             (float)bufferHeight - local_18._4_4_,(double)v2);
  vVar7 = glm::unProject<float,float,(glm::qualifier)0>
                    (in_stack_fffffffffffffec0,(mat<4,_4,_float,_(glm::qualifier)0> *)this,proj_00,
                     viewport_00);
  auVar2._0_8_ = vVar7._0_8_;
  auVar2._8_56_ = auVar6;
  vmovlpd_avx(auVar2._0_16_);
  vVar8 = getCameraWorldPosition();
  auVar3._0_8_ = vVar8._0_8_;
  auVar3._8_56_ = auVar6;
  vmovlpd_avx(auVar3._0_16_);
  vVar7 = glm::operator-(v1,v2);
  auVar4._0_8_ = vVar7._0_8_;
  auVar4._8_56_ = auVar6;
  vmovlpd_avx(auVar4._0_16_);
  vVar7 = glm::normalize<3,float,(glm::qualifier)0>(v1);
  auVar5._0_8_ = vVar7._0_8_;
  auVar5._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  vVar8.field_2 = vVar7.field_2;
  vVar8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  vVar8.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  return vVar8;
}

Assistant:

glm::vec3 bufferCoordsToWorldRay(glm::vec2 screenCoords) {

  glm::mat4 view = getCameraViewMatrix();
  glm::mat4 proj = getCameraPerspectiveMatrix();
  glm::vec4 viewport = {0., 0., view::bufferWidth, view::bufferHeight};

  glm::vec3 screenPos3{screenCoords.x, view::bufferHeight - screenCoords.y, 0.};
  glm::vec3 worldPos = glm::unProject(screenPos3, view, proj, viewport);
  glm::vec3 worldRayDir = glm::normalize(glm::vec3(worldPos) - getCameraWorldPosition());

  return worldRayDir;
}